

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::probeUnitBase_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool numOnly;
  bool numOnly_00;
  double dVar3;
  precise_unit pVar4;
  string prefix;
  unit base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string beststr;
  string fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  size_t cut;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &beststr.field_2;
  beststr._M_string_length = 0;
  beststr.field_2._M_local_buf[0] = '\0';
  beststr._M_dataplus._M_p = (pointer)paVar1;
  pVar4 = precise_unit::operator*((precise_unit *)this,un);
  base.base_units_ = pVar4.base_units_;
  base.multiplier_ = 1.0;
  find_unit_abi_cxx11_((unit)prefix._M_dataplus._M_p);
  if (fnd._M_string_length == 0) {
LAB_00150300:
    unit::inv(&base);
    find_unit_abi_cxx11_((unit)prefix._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)&fnd,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (fnd._M_string_length != 0) {
      getMultiplierString_abi_cxx11_
                (&prefix,(units *)(ulong)((byte)(fnd._M_dataplus._M_p[fnd._M_string_length - 1] -
                                                0x30U) < 10),1.0 / pVar4.multiplier_,numOnly);
      std::__cxx11::string::string((string *)__return_storage_ptr__,"1/(",(allocator *)&str);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      if ((prefix._M_string_length == 0) ||
         ((bVar2 = *prefix._M_dataplus._M_p, 9 < (byte)(bVar2 - 0x30) &&
          ((0x2e < bVar2 || ((0x680000000000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) == 0))))))
      goto LAB_00150767;
      if (__return_storage_ptr__->_M_string_length <= beststr._M_string_length - 1) {
        std::__cxx11::string::operator=((string *)&beststr,(string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&prefix);
    }
    pVar4 = precise_unit::operator/((precise_unit *)this,un);
    base = (unit)(pVar4._8_8_ << 0x20 | 0x3f800000);
    find_unit_abi_cxx11_((unit)prefix._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)&fnd,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (fnd._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_70,(string *)&fnd);
      generateUnitSequence(&prefix,pVar4.multiplier_,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix,
                     '*');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                     (char *)un[1].multiplier_);
      std::__cxx11::string::~string((string *)&str);
      bVar2 = *(__return_storage_ptr__->_M_dataplus)._M_p;
      if ((9 < (byte)(bVar2 - 0x30)) &&
         ((0x2e < bVar2 || ((0x680000000000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) == 0))))
      goto LAB_00150767;
      if (__return_storage_ptr__->_M_string_length <= beststr._M_string_length - 1) {
        std::__cxx11::string::_M_assign((string *)&beststr);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&prefix);
    }
    unit::inv(&base);
    find_unit_abi_cxx11_((unit)prefix._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)&fnd,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (fnd._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_90,(string *)&fnd);
      generateUnitSequence(&prefix,1.0 / pVar4.multiplier_,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      bVar2 = *prefix._M_dataplus._M_p;
      if ((9 < (byte)(bVar2 - 0x30)) &&
         ((0x2e < bVar2 || ((0x680000000000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) == 0)))) {
        std::__cxx11::string::string
                  ((string *)&local_118,(char *)un[1].multiplier_,(allocator *)&local_f0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                       &local_118,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix)
        ;
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::string::~string((string *)&local_118);
        goto LAB_00150767;
      }
      cut = 0;
      dVar3 = getDoubleFromString(&prefix,&cut);
      getMultiplierString_abi_cxx11_(&local_b0,(units *)0x1,1.0 / dVar3,numOnly_00);
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                     (char *)un[1].multiplier_);
      std::operator+(&local_118,&local_f0,"/");
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&prefix);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                     &local_118,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (str._M_string_length <= beststr._M_string_length - 1) {
        std::__cxx11::string::_M_assign((string *)&beststr);
      }
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&prefix);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)beststr._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(beststr.field_2._M_allocated_capacity._1_7_,beststr.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = beststr.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = beststr._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(beststr.field_2._M_allocated_capacity._1_7_,beststr.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = beststr._M_string_length;
    beststr._M_string_length = 0;
    beststr.field_2._M_local_buf[0] = '\0';
    beststr._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)&fnd);
    generateUnitSequence(&prefix,pVar4.multiplier_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix,'/')
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                   (char *)un[1].multiplier_);
    std::__cxx11::string::~string((string *)&str);
    bVar2 = *(__return_storage_ptr__->_M_dataplus)._M_p;
    if (((byte)(bVar2 - 0x30) < 10) ||
       ((bVar2 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)))) {
      if (__return_storage_ptr__->_M_string_length <= beststr._M_string_length - 1) {
        std::__cxx11::string::_M_assign((string *)&beststr);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&prefix);
      goto LAB_00150300;
    }
LAB_00150767:
    std::__cxx11::string::~string((string *)&prefix);
  }
  std::__cxx11::string::~string((string *)&fnd);
  std::__cxx11::string::~string((string *)&beststr);
  return __return_storage_ptr__;
}

Assistant:

static std::string probeUnitBase(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    std::string beststr;
    // let's try common divisor units on base units
    auto ext = un * probe.first;
    auto base = unit(ext.base_units());
    auto fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);

        auto str = prefix + '/' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try inverse of common multiplier units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = getMultiplierString(
            1.0 / ext.multiplier(), isDigitCharacter(fnd.back()));
        std::string str{"1/("};
        str += prefix;
        str += fnd;
        str.push_back('*');
        str.append(probe.second);
        str.push_back(')');
        if (prefix.empty() || !isNumericalStartCharacter(prefix.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = std::move(str);
        }
    }
    // let's try common multiplier units on base units
    ext = un / probe.first;
    base = unit(ext.base_units());
    fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);
        auto str = prefix + '*' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try common divisor with inv units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(1.0 / ext.multiplier(), fnd);
        if (isNumericalStartCharacter(prefix.front())) {
            size_t cut{0};
            double mx = getDoubleFromString(prefix, &cut);

            auto str = getMultiplierString(1.0 / mx, true) + probe.second +
                "/" + prefix.substr(cut);
            if (beststr.empty() || str.size() < beststr.size()) {
                beststr = str;
            }

        } else {
            return std::string(probe.second) + "/" + prefix;
        }
    }
    return beststr;
}